

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

string * __thiscall tinyusdz::Path::variant_part_abi_cxx11_(Path *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&bStack_a8,"{",&this->_variant_part);
  std::operator+(&local_88,&bStack_a8,"=");
  std::operator+(&local_68,&local_88,&this->_variant_selection_part);
  std::operator+(&local_48,&local_68,"}");
  std::__cxx11::string::operator=((string *)&this->_variant_part_str,(string *)&local_48);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return &this->_variant_part_str;
}

Assistant:

const std::string &variant_part() const {
    _variant_part_str =
        "{" + _variant_part + "=" + _variant_selection_part + "}";
    return _variant_part_str;
  }